

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

bool __thiscall
duckdb::BitpackingState<unsigned_long,_long>::Flush<duckdb::EmptyBitpackingWriter>
          (BitpackingState<unsigned_long,_long> *this)

{
  unsigned_long *puVar1;
  long lVar2;
  bool bVar3;
  unsigned_long uVar4;
  idx_t iVar5;
  ulong uVar6;
  bool bVar7;
  byte bVar8;
  unsigned_long value;
  uint64_t right;
  uint64_t left;
  byte bVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  
  bVar7 = true;
  if (this->compression_buffer_idx == 0) {
    return true;
  }
  if (this->all_invalid == false) {
    right = this->minimum;
    left = this->maximum;
    if (left != right) goto LAB_0107c0aa;
  }
  if ((byte)(this->mode - AUTO) < 2) {
    this->total_size = this->total_size + 0xc;
    return true;
  }
  right = this->minimum;
  left = this->maximum;
LAB_0107c0aa:
  bVar3 = TrySubtractOperator::Operation<unsigned_long,unsigned_long,unsigned_long>
                    (left,right,&this->min_max_diff);
  this->can_do_for = bVar3;
  CalculateDeltaStats(this);
  if (this->can_do_delta == true) {
    lVar10 = this->minimum_delta;
    if ((this->mode & ~AUTO) != DELTA_FOR && this->maximum_delta == lVar10) {
      this->total_size = this->total_size + 0x14;
      return true;
    }
    uVar12 = this->min_max_diff;
    uVar11 = this->min_max_delta_diff;
    lVar2 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    bVar9 = 0x40 - ((byte)lVar2 ^ 0x3f);
    if (uVar11 >> 0x38 != 0) {
      bVar9 = 0x40;
    }
    bVar8 = 0;
    if (uVar11 != 0) {
      bVar8 = bVar9;
    }
    lVar2 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    bVar9 = 0x40 - ((byte)lVar2 ^ 0x3f);
    if (uVar12 >> 0x38 != 0) {
      bVar9 = 0x40;
    }
    if ((this->mode != FOR && uVar12 != 0) && bVar8 < bVar9) {
      if (this->compression_buffer_idx == 0) {
        iVar5 = this->total_size + 0x18;
        uVar12 = 0;
      }
      else {
        uVar11 = 0;
        do {
          this->delta_buffer[uVar11] = this->delta_buffer[uVar11] - lVar10;
          uVar11 = uVar11 + 1;
          uVar12 = this->compression_buffer_idx;
        } while (uVar11 < uVar12);
        iVar5 = this->total_size + 0x18;
        this->total_size = iVar5;
        if ((uVar12 & 0x1f) != 0) {
          uVar4 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar12 & 0x1f);
          uVar12 = (uVar12 - uVar4) + 0x20;
          iVar5 = this->total_size;
        }
      }
      this->total_size = (bVar8 * uVar12 >> 3) + iVar5;
      return true;
    }
  }
  if (this->can_do_for == true) {
    uVar12 = this->min_max_diff;
    uVar11 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    lVar10 = 0x40;
    if (uVar12 >> 0x38 == 0) {
      lVar10 = (uVar11 ^ 0xffffffffffffffc0) + 0x41;
    }
    if (this->compression_buffer_idx == 0) {
      uVar11 = 0;
    }
    else {
      puVar1 = this->compression_buffer;
      uVar4 = this->minimum;
      uVar6 = 0;
      do {
        puVar1[uVar6] = puVar1[uVar6] - uVar4;
        uVar6 = uVar6 + 1;
        uVar11 = this->compression_buffer_idx;
      } while (uVar6 < uVar11);
      if ((uVar11 & 0x1f) != 0) {
        uVar4 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar11 & 0x1f);
        uVar11 = (uVar11 - uVar4) + 0x20;
      }
    }
    if (uVar12 == 0) {
      lVar10 = 0;
    }
    this->total_size = this->total_size + (lVar10 * uVar11 >> 3) + 0x10;
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}